

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.cpp
# Opt level: O1

void __thiscall chrono::ChPhysicsItem::ArchiveIN(ChPhysicsItem *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChPhysicsItem>(marchive);
  ChObj::ArchiveIN(&this->super_ChObj,marchive);
  return;
}

Assistant:

void ChPhysicsItem::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChPhysicsItem>();

    // deserialize parent class
    ChObj::ArchiveIN(marchive);

    // stream in all member data:
    // marchive >> CHNVP(system); ***TODO***
    // marchive >> CHNVP(offset_x);
    // marchive >> CHNVP(offset_w);
    // marchive >> CHNVP(offset_L);
}